

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O3

Aig_Man_t *
Saig_ManCbaUnrollWithCex
          (Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,Vec_Int_t **pvMapPiF2A,
          Vec_Vec_t **pvReg2Frame)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  Vec_Vec_t *pVVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  void *pvVar11;
  void *pvVar12;
  Aig_Man_t *p;
  size_t sVar13;
  char *pcVar14;
  Aig_Obj_t *pAVar15;
  void **ppvVar16;
  uint uVar17;
  ulong uVar18;
  Aig_Obj_t *p1;
  int i;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  int local_b8;
  void *local_a0;
  void *local_78;
  
  if (pAig->nTruePis != pCex->nPis) {
    __assert_fail("Saig_ManPiNum(pAig) == pCex->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x198,
                  "Aig_Man_t *Saig_ManCbaUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **, Vec_Vec_t **)"
                 );
  }
  iVar8 = pCex->iPo;
  if (((long)iVar8 < 0) || (pAig->nTruePos <= iVar8)) {
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x19a,
                  "Aig_Man_t *Saig_ManCbaUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **, Vec_Vec_t **)"
                 );
  }
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(4000);
  pVVar9->pArray = piVar10;
  *pvMapPiF2A = pVVar9;
  uVar7 = pCex->iFrame;
  uVar6 = uVar7 + 1;
  uVar17 = 8;
  if (6 < (ulong)uVar7) {
    uVar17 = uVar6;
  }
  if (uVar17 == 0) {
    local_a0 = (void *)0x0;
  }
  else {
    local_a0 = malloc((long)(int)uVar17 * 8);
  }
  uVar19 = (ulong)uVar6;
  if (uVar7 < 0x7fffffff) {
    uVar25 = 0;
    do {
      pvVar11 = calloc(1,0x10);
      *(void **)((long)local_a0 + uVar25 * 8) = pvVar11;
      uVar25 = uVar25 + 1;
    } while (uVar19 != uVar25);
  }
  if (uVar17 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = malloc((long)(int)uVar17 << 3);
  }
  if (uVar7 < 0x7fffffff) {
    uVar25 = 0;
    do {
      pvVar12 = calloc(1,0x10);
      *(void **)((long)pvVar11 + uVar25 * 8) = pvVar12;
      uVar25 = uVar25 + 1;
    } while (uVar19 != uVar25);
  }
  if (iVar8 < pAig->vCos->nSize) {
    iVar8 = *(int *)((long)pAig->vCos->pArray[iVar8] + 0x24);
    local_78 = local_a0;
    if (uVar7 == 0x7fffffff) {
      if (local_a0 == (void *)0x0) {
        local_78 = malloc(0xfffffffc00000000);
      }
      else {
        local_78 = realloc(local_a0,0xfffffffc00000000);
      }
      lVar22 = 0;
      do {
        pvVar12 = calloc(1,0x10);
        *(void **)((long)local_a0 + lVar22 * 8 + -0x400000000) = pvVar12;
        lVar22 = lVar22 + 1;
      } while ((int)lVar22 != 0);
    }
    if (0x7ffffffe < uVar7) {
LAB_00611f9a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                    ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
    }
    Vec_IntPush(*(Vec_Int_t **)((long)local_a0 + (ulong)uVar7 * 8),iVar8);
    lVar22 = (long)pCex->iFrame;
    if (-1 < (long)pCex->iFrame) {
      do {
        Aig_ManIncrementTravId(pAig);
        if ((long)uVar19 <= lVar22) goto LAB_00611f9a;
        lVar24 = *(long *)((long)local_a0 + lVar22 * 8);
        if (0 < *(int *)(lVar24 + 4)) {
          lVar23 = 0;
          do {
            pVVar2 = pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              pAVar15 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar7 = *(uint *)(*(long *)(lVar24 + 8) + lVar23 * 4);
              if (((int)uVar7 < 0) || (pVVar2->nSize <= (int)uVar7)) goto LAB_00611f5c;
              pAVar15 = (Aig_Obj_t *)pVVar2->pArray[uVar7];
            }
            if (lVar22 == 0) {
              pVVar9 = (Vec_Int_t *)0x0;
            }
            else {
              pVVar9 = *(Vec_Int_t **)((long)local_a0 + lVar22 * 8 + -8);
            }
            Saig_ManCbaUnrollCollect_rec
                      (pAig,pAVar15,*(Vec_Int_t **)((long)pvVar11 + lVar22 * 8),pVVar9);
            lVar23 = lVar23 + 1;
          } while (lVar23 < *(int *)(lVar24 + 4));
        }
        bVar5 = 0 < lVar22;
        lVar22 = lVar22 + -1;
      } while (bVar5);
    }
    p = Aig_ManStart(10000);
    pcVar3 = pAig->pName;
    if (pcVar3 == (char *)0x0) {
      pcVar14 = (char *)0x0;
    }
    else {
      sVar13 = strlen(pcVar3);
      pcVar14 = (char *)malloc(sVar13 + 1);
      strcpy(pcVar14,pcVar3);
    }
    p->pName = pcVar14;
    pcVar3 = pAig->pSpec;
    if (pcVar3 == (char *)0x0) {
      pcVar14 = (char *)0x0;
    }
    else {
      sVar13 = strlen(pcVar3);
      pcVar14 = (char *)malloc(sVar13 + 1);
      strcpy(pcVar14,pcVar3);
    }
    p->pSpec = pcVar14;
    iVar8 = pAig->nRegs;
    if (iVar8 == pCex->nRegs) {
      if (0 < iVar8) {
        uVar7 = 0;
        do {
          uVar17 = pAig->nTruePis + uVar7;
          if (((int)uVar17 < 0) || (pAig->vCis->nSize <= (int)uVar17)) goto LAB_00611f5c;
          *(ulong *)((long)pAig->vCis->pArray[uVar17] + 0x28) =
               (ulong)(((uint)(&pCex[1].iPo)[uVar7 >> 5] >> (uVar7 & 0x1f) & 1) == 0) ^
               (ulong)p->pConst1;
          uVar7 = uVar7 + 1;
        } while ((int)uVar7 < pAig->nRegs);
      }
    }
    else if (0 < iVar8) {
      iVar8 = 0;
      do {
        uVar7 = pAig->nTruePis + iVar8;
        if (((int)uVar7 < 0) || (pAig->vCis->nSize <= (int)uVar7)) goto LAB_00611f5c;
        *(ulong *)((long)pAig->vCis->pArray[uVar7] + 0x28) = (ulong)p->pConst1 ^ 1;
        iVar8 = iVar8 + 1;
      } while (iVar8 < pAig->nRegs);
    }
    uVar7 = pCex->iFrame;
    if (-1 < (int)uVar7) {
      uVar25 = 0;
      if (0 < (int)uVar6) {
        uVar25 = (ulong)uVar6;
      }
      uVar21 = 0;
      do {
        if (uVar21 == uVar25) goto LAB_00611f9a;
        lVar22 = *(long *)((long)pvVar11 + uVar21 * 8);
        local_b8 = (int)uVar21;
        if (0 < *(int *)(lVar22 + 4)) {
          lVar24 = 0;
          do {
            pVVar2 = pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              piVar10 = (int *)0x0;
            }
            else {
              uVar7 = *(uint *)(*(long *)(lVar22 + 8) + lVar24 * 4);
              if (((int)uVar7 < 0) || (pVVar2->nSize <= (int)uVar7)) goto LAB_00611f5c;
              piVar10 = (int *)pVVar2->pArray[uVar7];
            }
            if (((uint)*(undefined8 *)(piVar10 + 6) & 7) - 7 < 0xfffffffe) {
              uVar7 = (uint)*(undefined8 *)(piVar10 + 6) & 7;
              if (uVar7 == 3) {
                if (((ulong)piVar10 & 1) != 0) goto LAB_00611fb9;
                uVar18 = *(ulong *)(piVar10 + 2) & 0xfffffffffffffffe;
                if (uVar18 == 0) {
                  pAVar15 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar15 = (Aig_Obj_t *)
                            ((ulong)((uint)*(ulong *)(piVar10 + 2) & 1) ^ *(ulong *)(uVar18 + 0x28))
                  ;
                }
LAB_00611b2f:
                *(Aig_Obj_t **)(piVar10 + 10) = pAVar15;
              }
              else {
                if (((ulong)piVar10 & 1) != 0) {
                  __assert_fail("!Aig_IsComplement(pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                                ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
                }
                if (uVar7 == 2) {
                  iVar8 = *piVar10;
                  if (iVar8 < pAig->nTruePis) {
                    if (iVar8 < nInputs) {
                      uVar7 = iVar8 + pCex->nRegs + pCex->nPis * local_b8;
                      *(ulong *)(piVar10 + 10) =
                           (ulong)(((uint)(&pCex[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) ==
                                  0) ^ (ulong)p->pConst1;
                    }
                    else {
                      pAVar15 = Aig_ObjCreateCi(p);
                      *(Aig_Obj_t **)(piVar10 + 10) = pAVar15;
                      if (0xfffffffd < (piVar10[6] & 7U) - 7) {
                        __assert_fail("!Aig_ObjIsNode(pObj)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                                      ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
                      }
                      Vec_IntPush(*pvMapPiF2A,*piVar10);
                      Vec_IntPush(*pvMapPiF2A,local_b8);
                    }
                  }
                }
                else if (uVar7 == 1) {
                  pAVar15 = p->pConst1;
                  goto LAB_00611b2f;
                }
              }
            }
            else {
              if (((ulong)piVar10 & 1) != 0) {
LAB_00611fb9:
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
              }
              uVar18 = *(ulong *)(piVar10 + 2) & 0xfffffffffffffffe;
              if (uVar18 == 0) {
                pAVar15 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar15 = (Aig_Obj_t *)
                          ((ulong)((uint)*(ulong *)(piVar10 + 2) & 1) ^ *(ulong *)(uVar18 + 0x28));
              }
              uVar18 = *(ulong *)(piVar10 + 4) & 0xfffffffffffffffe;
              if (uVar18 == 0) {
                p1 = (Aig_Obj_t *)0x0;
              }
              else {
                p1 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)(piVar10 + 4) & 1) ^ *(ulong *)(uVar18 + 0x28));
              }
              pAVar15 = Aig_And(p,pAVar15,p1);
              *(Aig_Obj_t **)(piVar10 + 10) = pAVar15;
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 < *(int *)(lVar22 + 4));
          uVar7 = pCex->iFrame;
        }
        if (uVar21 == uVar7) break;
        if ((long)(int)uVar6 <= (long)uVar21) goto LAB_00611f9a;
        lVar22 = *(long *)((long)local_a0 + uVar21 * 8);
        if (0 < *(int *)(lVar22 + 4)) {
          sVar13 = uVar21 * 8 + 8;
          lVar24 = 0;
          do {
            iVar8 = local_b8 + 1;
            pVVar2 = pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              piVar10 = (int *)0x0;
            }
            else {
              uVar7 = *(uint *)(*(long *)(lVar22 + 8) + lVar24 * 4);
              if (((int)uVar7 < 0) || (pVVar2->nSize <= (int)uVar7)) goto LAB_00611f5c;
              piVar10 = (int *)pVVar2->pArray[uVar7];
            }
            if (((piVar10[6] & 7U) != 3) || (*piVar10 < pAig->nTruePos)) {
              __assert_fail("Saig_ObjIsLi(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                            ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
            }
            uVar7 = (*piVar10 - pAig->nTruePos) + pAig->nTruePis;
            if (((int)uVar7 < 0) || (pAig->vCis->nSize <= (int)uVar7)) goto LAB_00611f5c;
            *(undefined8 *)((long)pAig->vCis->pArray[uVar7] + 0x28) = *(undefined8 *)(piVar10 + 10);
            pVVar4 = *pvReg2Frame;
            if (pVVar4 != (Vec_Vec_t *)0x0) {
              iVar1 = piVar10[9];
              lVar23 = (long)pVVar4->nSize;
              if (lVar23 <= (long)uVar21) {
                if ((long)pVVar4->nCap <= (long)uVar21) {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar16 = (void **)malloc(sVar13);
                  }
                  else {
                    ppvVar16 = (void **)realloc(pVVar4->pArray,sVar13);
                    lVar23 = (long)pVVar4->nSize;
                  }
                  pVVar4->pArray = ppvVar16;
                  pVVar4->nCap = local_b8 + 1;
                }
                if (lVar23 <= (long)uVar21) {
                  iVar20 = (local_b8 + 1) - (int)lVar23;
                  do {
                    pvVar12 = calloc(1,0x10);
                    pVVar4->pArray[lVar23] = pvVar12;
                    lVar23 = lVar23 + 1;
                    iVar20 = iVar20 + -1;
                  } while (iVar20 != 0);
                }
                pVVar4->nSize = iVar8;
                lVar23 = (long)(local_b8 + 1);
              }
              if (lVar23 <= (long)uVar21) goto LAB_00611f9a;
              Vec_IntPush((Vec_Int_t *)pVVar4->pArray[uVar21],iVar1);
              uVar18 = *(ulong *)(piVar10 + 10);
              iVar1 = *(int *)((uVar18 & 0xfffffffffffffffe) + 0x24);
              if (iVar1 < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              pVVar4 = *pvReg2Frame;
              lVar23 = (long)pVVar4->nSize;
              if (lVar23 <= (long)uVar21) {
                if ((long)pVVar4->nCap <= (long)uVar21) {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar16 = (void **)malloc(sVar13);
                  }
                  else {
                    ppvVar16 = (void **)realloc(pVVar4->pArray,sVar13);
                    lVar23 = (long)pVVar4->nSize;
                  }
                  pVVar4->pArray = ppvVar16;
                  pVVar4->nCap = iVar8;
                }
                if (lVar23 <= (long)uVar21) {
                  iVar20 = (local_b8 + 1) - (int)lVar23;
                  do {
                    pvVar12 = calloc(1,0x10);
                    pVVar4->pArray[lVar23] = pvVar12;
                    lVar23 = lVar23 + 1;
                    iVar20 = iVar20 + -1;
                  } while (iVar20 != 0);
                }
                pVVar4->nSize = iVar8;
                lVar23 = (long)(local_b8 + 1);
              }
              if (lVar23 <= (long)uVar21) goto LAB_00611f9a;
              Vec_IntPush((Vec_Int_t *)pVVar4->pArray[uVar21],((uint)uVar18 & 1) + iVar1 * 2);
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 < *(int *)(lVar22 + 4));
          uVar7 = pCex->iFrame;
        }
        bVar5 = (long)uVar21 < (long)(int)uVar7;
        uVar21 = uVar21 + 1;
      } while (bVar5);
    }
    iVar8 = pCex->iPo;
    if ((-1 < (long)iVar8) && (iVar8 < pAig->vCos->nSize)) {
      Aig_ObjCreateCo(p,(Aig_Obj_t *)(*(ulong *)((long)pAig->vCos->pArray[iVar8] + 0x28) ^ 1));
      uVar25 = 0;
      Aig_ManSetRegNum(p,0);
      do {
        pvVar12 = *(void **)((long)local_a0 + uVar25 * 8);
        if (pvVar12 != (void *)0x0) {
          if (*(void **)((long)pvVar12 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar12 + 8));
          }
          free(pvVar12);
        }
        uVar25 = uVar25 + 1;
      } while (uVar19 != uVar25);
      if (local_78 != (void *)0x0) {
        free(local_78);
      }
      uVar19 = 1;
      if (1 < (int)uVar6) {
        uVar19 = (ulong)uVar6;
      }
      uVar25 = 0;
      do {
        pvVar12 = *(void **)((long)pvVar11 + uVar25 * 8);
        if (pvVar12 != (void *)0x0) {
          if (*(void **)((long)pvVar12 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar12 + 8));
          }
          free(pvVar12);
        }
        uVar25 = uVar25 + 1;
      } while (uVar19 != uVar25);
      free(pvVar11);
      Aig_ManCleanup(p);
      return p;
    }
  }
LAB_00611f5c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManCbaUnrollWithCex( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, Vec_Int_t ** pvMapPiF2A, Vec_Vec_t ** pvReg2Frame )
{
    Aig_Man_t * pFrames;     // unrolled timeframes
    Vec_Vec_t * vFrameCos;   // the list of COs per frame
    Vec_Vec_t * vFrameObjs;  // the list of objects per frame
    Vec_Int_t * vRoots, * vObjs;
    Aig_Obj_t * pObj;
    int i, f;
    // sanity checks
    assert( Saig_ManPiNum(pAig) == pCex->nPis );
//    assert( Saig_ManRegNum(pAig) == pCex->nRegs );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );

    // map PIs of the unrolled frames into PIs of the original design
    *pvMapPiF2A = Vec_IntAlloc( 1000 );

    // collect COs and Objs visited in each frame
    vFrameCos  = Vec_VecStart( pCex->iFrame+1 );
    vFrameObjs = Vec_VecStart( pCex->iFrame+1 );
    // initialized the topmost frame
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Vec_VecPushInt( vFrameCos, pCex->iFrame, Aig_ObjId(pObj) );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCbaUnrollCollect_rec( pAig, pObj, 
                Vec_VecEntryInt(vFrameObjs, f),
                (Vec_Int_t *)(f ? Vec_VecEntry(vFrameCos, f-1) : NULL) );
    }

    // derive unrolled timeframes
    pFrames = Aig_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // initialize the flops 
    if ( Saig_ManRegNum(pAig) == pCex->nRegs )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, i) );
    }
    else // this is the case when synthesis was applied, assume all-0 init state
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), 1 );
    }
    // iterate through the frames
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // construct
        vObjs = Vec_VecEntryInt( vFrameObjs, f );
        Aig_ManForEachObjVec( vObjs, pAig, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) )
                pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else if ( Aig_ObjIsCo(pObj) )
                pObj->pData = Aig_ObjChild0Copy(pObj);
            else if ( Aig_ObjIsConst1(pObj) )
                pObj->pData = Aig_ManConst1(pFrames);
            else if ( Saig_ObjIsPi(pAig, pObj) )
            {
                if ( Aig_ObjCioId(pObj) < nInputs )
                {
                    int iBit = pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj);
                    pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, iBit) );
                }
                else
                {
                    pObj->pData = Aig_ObjCreateCi( pFrames );
                    Vec_IntPush( *pvMapPiF2A, Aig_ObjCioId(pObj) );
                    Vec_IntPush( *pvMapPiF2A, f );
                }
            }
        }
        if ( f == pCex->iFrame )
            break;
        // transfer
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
        {
            Saig_ObjLiToLo( pAig, pObj )->pData = pObj->pData;
            if ( *pvReg2Frame )
            {
                Vec_VecPushInt( *pvReg2Frame, f, Aig_ObjId(pObj) );             // record LO
                Vec_VecPushInt( *pvReg2Frame, f, Aig_ObjToLit((Aig_Obj_t *)pObj->pData) ); // record its literal
            }
        }
    }
    // create output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Aig_ObjCreateCo( pFrames, Aig_Not((Aig_Obj_t *)pObj->pData) );
    Aig_ManSetRegNum( pFrames, 0 );
    // cleanup
    Vec_VecFree( vFrameCos );
    Vec_VecFree( vFrameObjs );
    // finallize
    Aig_ManCleanup( pFrames );
    // return
    return pFrames;
}